

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_strfilter(char *text,char *regexp)

{
  char cVar1;
  int iVar2;
  char *regexp_local;
  char *text_local;
  
  regexp_local = text;
  if (*regexp == '^') {
    text_local._4_4_ = nk_str_match_here(regexp + 1,text);
  }
  else {
    do {
      iVar2 = nk_str_match_here(regexp,regexp_local);
      if (iVar2 != 0) {
        return 1;
      }
      cVar1 = *regexp_local;
      regexp_local = regexp_local + 1;
    } while (cVar1 != '\0');
    text_local._4_4_ = 0;
  }
  return text_local._4_4_;
}

Assistant:

NK_API int
nk_strfilter(const char *text, const char *regexp)
{
    /*
    c    matches any literal character c
    .    matches any single character
    ^    matches the beginning of the input string
    $    matches the end of the input string
    *    matches zero or more occurrences of the previous character*/
    if (regexp[0] == '^')
        return nk_str_match_here(regexp+1, text);
    do {    /* must look even if string is empty */
        if (nk_str_match_here(regexp, text))
            return 1;
    } while (*text++ != '\0');
    return 0;
}